

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_executed *m)

{
  order_book *this_00;
  iterator iVar1;
  uint64_t quantity;
  uint64_t uVar2;
  uint64_t order_id;
  undefined1 local_a8 [64];
  execution result;
  trade t;
  
  order_id = itch_uatoi(m->OrderReferenceNumber,9);
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_helix::order_book_&>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->order_id_map)._M_h,&order_id);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>.
      _M_cur != (__node_type *)0x0) {
    quantity = itch_uatoi(m->ExecutedQuantity,9);
    this_00 = *(order_book **)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false>
                      ._M_cur + 0x10);
    order_book::execute(&result,this_00,order_id,quantity);
    uVar2 = this->time_sec * 1000 + this->time_msec;
    this_00->_timestamp = uVar2;
    t.sign = itch_trade_sign(result.side);
    t.price = result.price;
    t.timestamp = uVar2;
    t.size = quantity;
    make_event((event *)local_a8,&this_00->_symbol,this->time_sec * 1000 + this->time_msec,this_00,
               &t,(uint)(result.remaining == 0) << 2);
    std::function<void_(const_helix::event_&)>::operator()(&this->_process_event,(event *)local_a8);
    std::__cxx11::string::~string((string *)(local_a8 + 8));
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_executed* m)
{
   uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
   auto it = order_id_map.find(order_id);
   if (it != order_id_map.end()) {
       uint64_t quantity = itch_uatoi(m->ExecutedQuantity, sizeof(m->ExecutedQuantity));
       auto& ob = it->second;
       auto result = ob.execute(order_id, quantity);
       ob.set_timestamp(timestamp());
       trade t{timestamp(), result.price, quantity, itch_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp(), &ob, &t, sweep_event(result)));
   }
}